

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_scene.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_3307ce::PrecacheProgress::Update(PrecacheProgress *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  FFont *pFVar4;
  uint uVar5;
  int iVar6;
  BYTE *string;
  
  uVar5 = I_FPSTime();
  if (0xf9 < uVar5 - this->m_time) {
    string = (BYTE *)FStringTable::operator()(&GStrings,"TXT_PRECACHE_WAIT");
    pFVar4 = BigFont;
    iVar1 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
    iVar6 = FFont::StringWidth(BigFont,string);
    iVar6 = iVar6 * CleanXfac;
    iVar2 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
    iVar3 = pFVar4->FontHeight;
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[8])(screen,0);
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x25])(screen,0);
    if (this->m_dimmed == false) {
      (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xe])
                (0x3f6e147b,screen,0,0,0,
                 (ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Width,
                 (ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Height);
      this->m_dimmed = true;
    }
    DCanvas::DrawText((DCanvas *)screen,BigFont,this->m_color,(iVar1 - iVar6) / 2,
                      (iVar2 - iVar3) / 2,(char *)string,0x40001393,1,0);
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x19])();
    this->m_time = uVar5;
    this->m_color = (uint)(this->m_color != CR_YELLOW) * 5 + CR_GOLD;
  }
  return;
}

Assistant:

void Update()
	{
		static const unsigned int UPDATE_TIME_MS = 250;
		const unsigned int now = I_FPSTime();

		if (UPDATE_TIME_MS > now - m_time)
		{
			return;
		}

		const char* const loadingMessage = GStrings("TXT_PRECACHE_WAIT");
		FFont* const font = BigFont;

		const int x = (SCREENWIDTH  - font->StringWidth(loadingMessage) * CleanXfac) / 2;
		const int y = (SCREENHEIGHT - font->GetHeight()) / 2;

		screen->Lock(false);
		screen->Begin2D(false);

		if (!m_dimmed)
		{
			// Dim amount is a guess value
			// [?] should depend on gamma/brightness/contrast [?]
			screen->Dim(0, 0.93f, 0, 0, SCREENWIDTH, SCREENHEIGHT);
			m_dimmed = true;
		}

		screen->DrawText(BigFont, m_color, x, y, loadingMessage, DTA_CleanNoMove, true, TAG_DONE);
		screen->Update();

		m_time  = now;
		m_color = (CR_YELLOW == m_color) ? CR_GOLD : CR_YELLOW;
	}